

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O0

void UConverter_fromUnicode_ISO_2022_CN_OFFSETS_LOGIC
               (UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  UChar UVar1;
  uint8_t *targetLimit_00;
  UChar *pUVar2;
  UBool UVar3;
  uint uVar4;
  int32_t iVar5;
  int iVar6;
  byte bVar7;
  UChar *pUVar8;
  uint8_t *puVar9;
  int *piVar10;
  int32_t local_90;
  int32_t sourceIndex_1;
  int32_t sourceIndex;
  int32_t len2;
  uint32_t value;
  UChar UStack_78;
  int8_t cs0;
  int8_t g;
  int8_t cs;
  int32_t i;
  UChar trail;
  UBool useFallback;
  uint32_t targetValue;
  int32_t choiceCount;
  uint8_t uStack_64;
  int8_t choices [3];
  int32_t len;
  char buffer [8];
  UChar32 sourceChar;
  int32_t *offsets;
  UChar *sourceLimit;
  UChar *source;
  uint8_t *targetLimit;
  uint8_t *target;
  ISO2022State *pFromU2022State;
  UConverterDataISO2022 *converterData;
  UConverter *cnv;
  UErrorCode *err_local;
  UConverterFromUnicodeArgs *args_local;
  
  err_local = (UErrorCode *)args;
  cnv = (UConverter *)err;
  converterData = (UConverterDataISO2022 *)args->converter;
  targetLimit = (uint8_t *)args->target;
  targetLimit_00 = (uint8_t *)args->targetLimit;
  sourceLimit = args->source;
  pUVar2 = args->sourceLimit;
  stack0xffffffffffffffa8 = args->offsets;
  i = 0;
  pFromU2022State = (ISO2022State *)((UConverter *)converterData)->extraInfo;
  target = (uint8_t *)(((ISO2022State *)((UConverter *)converterData)->extraInfo)[0x10].cs + 2);
  _trail = 0;
  buffer._0_4_ = ((UConverter *)converterData)->fromUChar32;
  if (buffer._0_4_ == 0) goto LAB_004cb8ae;
  if (targetLimit_00 <= args->target) goto LAB_004cb8ae;
  while( true ) {
    if (pUVar2 <= sourceLimit) {
      *(undefined4 *)((long)&converterData->currentConverter + 4) = buffer._0_4_;
      goto LAB_004cbf4c;
    }
    UStack_78 = *sourceLimit;
    if ((UStack_78 & 0xfc00U) != 0xdc00) break;
    buffer._0_4_ = buffer._0_4_ * 0x400 + (uint)(ushort)UStack_78 + -0x35fdc00;
    *(undefined4 *)((long)&converterData->currentConverter + 4) = 0;
    sourceLimit = sourceLimit + 1;
    do {
      if ((int)buffer._0_4_ < 0x80) {
        bVar7 = (byte)buffer._0_4_;
        if (((int)buffer._0_4_ < 0x20) && ((1 << (bVar7 & 0x1f) & 0x800c000U) != 0)) {
          *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xc;
          *(undefined4 *)((long)&converterData->currentConverter + 4) = buffer._0_4_;
          goto LAB_004cbf4c;
        }
        if (target[4] == '\0') {
          _uStack_64 = CONCAT31(choices,bVar7);
          choiceCount = 1;
        }
        else {
          _uStack_64 = CONCAT11(bVar7,0xf);
          choiceCount = 2;
          target[4] = '\0';
          _trail = 0;
        }
        if ((buffer._0_4_ == 0xd) || (buffer._0_4_ == 10)) {
          memset(target,0,6);
          _trail = 0;
        }
      }
      else {
        if (_trail == 0) {
          targetValue._1_1_ = target[1];
          if (target[1] == '\0') {
            targetValue._1_1_ = '\x01';
          }
          if (*(int *)pFromU2022State[0x12].cs == 0) {
            if (targetValue._1_1_ == '\x01') {
              targetValue._2_1_ = 0x21;
            }
            else {
              targetValue._2_1_ = 1;
            }
            _trail = 2;
          }
          else if (*(int *)pFromU2022State[0x12].cs == 1) {
            if (targetValue._1_1_ == '\x01') {
              targetValue._2_1_ = 0x21;
              targetValue._3_1_ = 2;
            }
            else if (targetValue._1_1_ == '\x02') {
              targetValue._2_1_ = 1;
              targetValue._3_1_ = 0x21;
            }
            else {
              targetValue._2_1_ = 1;
              targetValue._3_1_ = 2;
            }
            _trail = 3;
          }
          else {
            targetValue._1_1_ = '!';
            targetValue._2_1_ = 1;
          }
        }
        len2._2_1_ = '\0';
        len2._3_1_ = '\0';
        choiceCount = 0;
        cs = *(int8_t *)((long)converterData->myConverterArray + 0x3f);
        for (value = 0; (int)value < _trail && choiceCount < 1; value = value + 1) {
          len2._1_1_ = *(uint8_t *)((long)&targetValue + (long)(int)value + 1);
          if ('\0' < (char)len2._1_1_) {
            if ((char)len2._1_1_ < ' ') {
              iVar5 = MBCS_FROM_UCHAR32_ISO2022
                                (*(UConverterSharedData **)
                                  ((long)pFromU2022State + (long)(char)len2._1_1_ * 8),buffer._0_4_,
                                 (uint32_t *)&sourceIndex,cs,1);
              if ((iVar5 == 2) || ((iVar5 == -2 && (choiceCount == 0)))) {
                i = sourceIndex;
                choiceCount = iVar5;
                len2._3_1_ = len2._1_1_;
                len2._2_1_ = '\x01';
                cs = '\0';
              }
            }
            else {
              iVar5 = MBCS_FROM_UCHAR32_ISO2022
                                (*(UConverterSharedData **)(pFromU2022State + 4),buffer._0_4_,
                                 (uint32_t *)&sourceIndex,cs,2);
              if ((iVar5 == 3) || ((iVar5 == -3 && (choiceCount == 0)))) {
                i = sourceIndex;
                len2._3_1_ = (char)((uint)sourceIndex >> 0x10) + 0xa0;
                if (iVar5 < 0) {
                  choiceCount = -2;
                  cs = '\0';
                }
                else {
                  choiceCount = 2;
                }
                if (len2._3_1_ == '!') {
                  len2._2_1_ = '\x01';
                }
                else if (len2._3_1_ == '\"') {
                  len2._2_1_ = '\x02';
                }
                else if (*(int *)pFromU2022State[0x12].cs == 1) {
                  len2._2_1_ = '\x03';
                }
                else {
                  choiceCount = 0;
                }
              }
            }
          }
        }
        if (choiceCount == 0) {
          *(undefined4 *)&cnv->fromUCharErrorBehaviour = 10;
          *(undefined4 *)((long)&converterData->currentConverter + 4) = buffer._0_4_;
          goto LAB_004cbf4c;
        }
        choiceCount = 0;
        if (len2._3_1_ != target[(char)len2._2_1_]) {
          if ((char)len2._3_1_ < '\x03') {
            _uStack_64 = *(undefined4 *)escSeqCharsCN[(char)len2._3_1_];
          }
          else {
            _uStack_64 = *(undefined4 *)escSeqCharsCN[(char)len2._3_1_ + -0x1e];
          }
          choiceCount = 4;
          target[(char)len2._2_1_] = len2._3_1_;
          if (len2._2_1_ == '\x01') {
            _trail = 0;
          }
        }
        if (len2._2_1_ != target[4]) {
          if (len2._2_1_ == '\x01') {
            (&stack0xffffffffffffff9c)[choiceCount] = 0xe;
            target[4] = '\x01';
            choiceCount = choiceCount + 1;
          }
          else if (len2._2_1_ == '\x02') {
            (&stack0xffffffffffffff9c)[choiceCount] = 0x1b;
            (&stack0xffffffffffffff9c)[choiceCount + 1] = 0x4e;
            choiceCount = choiceCount + 2;
          }
          else {
            (&stack0xffffffffffffff9c)[choiceCount] = 0x1b;
            (&stack0xffffffffffffff9c)[choiceCount + 1] = 0x4f;
            choiceCount = choiceCount + 2;
          }
        }
        iVar6 = choiceCount + 1;
        (&stack0xffffffffffffff9c)[choiceCount] = (char)((uint)i >> 8);
        choiceCount = choiceCount + 2;
        (&stack0xffffffffffffff9c)[iVar6] = (char)i;
      }
      puVar9 = targetLimit;
      piVar10 = stack0xffffffffffffffa8;
      if (choiceCount == 1) {
        targetLimit = targetLimit + 1;
        *puVar9 = uStack_64;
        if (stack0xffffffffffffffa8 != (int *)0x0) {
          stack0xffffffffffffffa8 = stack0xffffffffffffffa8 + 1;
          *piVar10 = (int)((long)sourceLimit - *(undefined8 *)(err_local + 4) >> 1) + -1;
        }
      }
      else if ((choiceCount == 2) && (targetLimit + 2 <= targetLimit_00)) {
        puVar9 = targetLimit + 1;
        *targetLimit = uStack_64;
        targetLimit = targetLimit + 2;
        *puVar9 = choices[0];
        if (stack0xffffffffffffffa8 != (int *)0x0) {
          iVar6 = 2;
          if ((uint)buffer._0_4_ < 0x10000) {
            iVar6 = 1;
          }
          iVar6 = (int)((long)sourceLimit - *(undefined8 *)(err_local + 4) >> 1) - iVar6;
          piVar10 = stack0xffffffffffffffa8 + 1;
          *stack0xffffffffffffffa8 = iVar6;
          stack0xffffffffffffffa8 = stack0xffffffffffffffa8 + 2;
          *piVar10 = iVar6;
        }
      }
      else {
        iVar6 = 2;
        if ((uint)buffer._0_4_ < 0x10000) {
          iVar6 = 1;
        }
        fromUWriteUInt8((UConverter *)converterData,(char *)&stack0xffffffffffffff9c,choiceCount,
                        &targetLimit,(char *)targetLimit_00,(int32_t **)(buffer + 4),
                        (int)((long)sourceLimit - *(undefined8 *)(err_local + 4) >> 1) - iVar6,
                        (UErrorCode *)cnv);
        UVar3 = U_FAILURE(*(UErrorCode *)&cnv->fromUCharErrorBehaviour);
        if (UVar3 != '\0') goto LAB_004cbf4c;
      }
LAB_004cb8ae:
      if (pUVar2 <= sourceLimit) goto LAB_004cbf4c;
      if (targetLimit_00 <= targetLimit) {
        *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xf;
        goto LAB_004cbf4c;
      }
      pUVar8 = sourceLimit + 1;
      UVar1 = *sourceLimit;
      uVar4 = (uint)(ushort)UVar1;
      buffer[0] = (char)uVar4;
      buffer[1] = (char)(uVar4 >> 8);
      buffer[2] = (char)(uVar4 >> 0x10);
      buffer[3] = (char)(uVar4 >> 0x18);
      sourceLimit = pUVar8;
    } while ((uVar4 & 0xfffff800) != 0xd800);
    if ((UVar1 & 0x400U) != 0) {
      *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xc;
      *(uint *)((long)&converterData->currentConverter + 4) = uVar4;
LAB_004cbf4c:
      UVar3 = U_SUCCESS(*(UErrorCode *)&cnv->fromUCharErrorBehaviour);
      if ((((UVar3 != '\0') && (target[4] != '\0')) && (*(byte *)((long)err_local + 2) != 0)) &&
         ((pUVar2 <= sourceLimit && (*(int *)((long)&converterData->currentConverter + 4) == 0)))) {
        target[4] = '\0';
        iVar6 = (int)((long)sourceLimit - *(undefined8 *)(err_local + 4) >> 1);
        if (iVar6 < 1) {
          local_90 = -1;
        }
        else {
          local_90 = iVar6 + -1;
          if (((*(ushort *)(*(undefined8 *)(err_local + 4) + (long)local_90 * 2) & 0xfc00) == 0xdc00
              ) && ((local_90 == 0 ||
                    ((*(ushort *)(*(undefined8 *)(err_local + 4) + (long)(iVar6 + -2) * 2) & 0xfc00)
                     == 0xd800)))) {
            local_90 = iVar6 + -2;
          }
        }
        fromUWriteUInt8((UConverter *)converterData,"\x0f",1,&targetLimit,(char *)targetLimit_00,
                        (int32_t **)(buffer + 4),local_90,(UErrorCode *)cnv);
      }
      *(UChar **)(err_local + 4) = sourceLimit;
      *(uint8_t **)(err_local + 8) = targetLimit;
      return;
    }
  }
  *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xc;
  *(undefined4 *)((long)&converterData->currentConverter + 4) = buffer._0_4_;
  goto LAB_004cbf4c;
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_ISO_2022_CN_OFFSETS_LOGIC(UConverterFromUnicodeArgs* args, UErrorCode* err){
    UConverter *cnv = args->converter;
    UConverterDataISO2022 *converterData;
    ISO2022State *pFromU2022State;
    uint8_t *target = (uint8_t *) args->target;
    const uint8_t *targetLimit = (const uint8_t *) args->targetLimit;
    const UChar* source = args->source;
    const UChar* sourceLimit = args->sourceLimit;
    int32_t* offsets = args->offsets;
    UChar32 sourceChar;
    char buffer[8];
    int32_t len;
    int8_t choices[3];
    int32_t choiceCount;
    uint32_t targetValue = 0;
    UBool useFallback;

    /* set up the state */
    converterData     = (UConverterDataISO2022*)cnv->extraInfo;
    pFromU2022State   = &converterData->fromU2022State;

    choiceCount = 0;

    /* check if the last codepoint of previous buffer was a lead surrogate*/
    if((sourceChar = cnv->fromUChar32)!=0 && target< targetLimit) {
        goto getTrail;
    }

    while( source < sourceLimit){
        if(target < targetLimit){

            sourceChar  = *(source++);
            /*check if the char is a First surrogate*/
             if(U16_IS_SURROGATE(sourceChar)) {
                if(U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                    /*look ahead to find the trail surrogate*/
                    if(source < sourceLimit) {
                        /* test the following code unit */
                        UChar trail=(UChar) *source;
                        if(U16_IS_TRAIL(trail)) {
                            source++;
                            sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                            cnv->fromUChar32=0x00;
                            /* convert this supplementary code point */
                            /* exit this condition tree */
                        } else {
                            /* this is an unmatched lead code unit (1st surrogate) */
                            /* callback(illegal) */
                            *err=U_ILLEGAL_CHAR_FOUND;
                            cnv->fromUChar32=sourceChar;
                            break;
                        }
                    } else {
                        /* no more input */
                        cnv->fromUChar32=sourceChar;
                        break;
                    }
                } else {
                    /* this is an unmatched trail code unit (2nd surrogate) */
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }
            }

            /* do the conversion */
            if(sourceChar <= 0x007f ){
                /* do not convert SO/SI/ESC */
                if(IS_2022_CONTROL(sourceChar)) {
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }

                /* US-ASCII */
                if(pFromU2022State->g == 0) {
                    buffer[0] = (char)sourceChar;
                    len = 1;
                } else {
                    buffer[0] = UCNV_SI;
                    buffer[1] = (char)sourceChar;
                    len = 2;
                    pFromU2022State->g = 0;
                    choiceCount = 0;
                }
                if(sourceChar == CR || sourceChar == LF) {
                    /* reset the state at the end of a line */
                    uprv_memset(pFromU2022State, 0, sizeof(ISO2022State));
                    choiceCount = 0;
                }
            }
            else{
                /* convert U+0080..U+10ffff */
                int32_t i;
                int8_t cs, g;

                if(choiceCount == 0) {
                    /* try the current SO/G1 converter first */
                    choices[0] = pFromU2022State->cs[1];

                    /* default to GB2312_1 if none is designated yet */
                    if(choices[0] == 0) {
                        choices[0] = GB2312_1;
                    }

                    if(converterData->version == 0) {
                        /* ISO-2022-CN */

                        /* try the other SO/G1 converter; a CNS_11643_1 lookup may result in any plane */
                        if(choices[0] == GB2312_1) {
                            choices[1] = (int8_t)CNS_11643_1;
                        } else {
                            choices[1] = (int8_t)GB2312_1;
                        }

                        choiceCount = 2;
                    } else if (converterData->version == 1) {
                        /* ISO-2022-CN-EXT */

                        /* try one of the other converters */
                        switch(choices[0]) {
                        case GB2312_1:
                            choices[1] = (int8_t)CNS_11643_1;
                            choices[2] = (int8_t)ISO_IR_165;
                            break;
                        case ISO_IR_165:
                            choices[1] = (int8_t)GB2312_1;
                            choices[2] = (int8_t)CNS_11643_1;
                            break;
                        default: /* CNS_11643_x */
                            choices[1] = (int8_t)GB2312_1;
                            choices[2] = (int8_t)ISO_IR_165;
                            break;
                        }

                        choiceCount = 3;
                    } else {
                        choices[0] = (int8_t)CNS_11643_1;
                        choices[1] = (int8_t)GB2312_1;
                    }
                }

                cs = g = 0;
                /*
                 * len==0: no mapping found yet
                 * len<0: found a fallback result: continue looking for a roundtrip but no further fallbacks
                 * len>0: found a roundtrip result, done
                 */
                len = 0;
                /*
                 * We will turn off useFallback after finding a fallback,
                 * but we still get fallbacks from PUA code points as usual.
                 * Therefore, we will also need to check that we don't overwrite
                 * an early fallback with a later one.
                 */
                useFallback = cnv->useFallback;

                for(i = 0; i < choiceCount && len <= 0; ++i) {
                    int8_t cs0 = choices[i];
                    if(cs0 > 0) {
                        uint32_t value;
                        int32_t len2;
                        if(cs0 >= CNS_11643_0) {
                            len2 = MBCS_FROM_UCHAR32_ISO2022(
                                        converterData->myConverterArray[CNS_11643],
                                        sourceChar,
                                        &value,
                                        useFallback,
                                        MBCS_OUTPUT_3);
                            if(len2 == 3 || (len2 == -3 && len == 0)) {
                                targetValue = value;
                                cs = (int8_t)(CNS_11643_0 + (value >> 16) - 0x80);
                                if(len2 >= 0) {
                                    len = 2;
                                } else {
                                    len = -2;
                                    useFallback = FALSE;
                                }
                                if(cs == CNS_11643_1) {
                                    g = 1;
                                } else if(cs == CNS_11643_2) {
                                    g = 2;
                                } else /* plane 3..7 */ if(converterData->version == 1) {
                                    g = 3;
                                } else {
                                    /* ISO-2022-CN (without -EXT) does not support plane 3..7 */
                                    len = 0;
                                }
                            }
                        } else {
                            /* GB2312_1 or ISO-IR-165 */
                            U_ASSERT(cs0<UCNV_2022_MAX_CONVERTERS);
                            len2 = MBCS_FROM_UCHAR32_ISO2022(
                                        converterData->myConverterArray[cs0],
                                        sourceChar,
                                        &value,
                                        useFallback,
                                        MBCS_OUTPUT_2);
                            if(len2 == 2 || (len2 == -2 && len == 0)) {
                                targetValue = value;
                                len = len2;
                                cs = cs0;
                                g = 1;
                                useFallback = FALSE;
                            }
                        }
                    }
                }

                if(len != 0) {
                    len = 0; /* count output bytes; it must have been abs(len) == 2 */

                    /* write the designation sequence if necessary */
                    if(cs != pFromU2022State->cs[g]) {
                        if(cs < CNS_11643) {
                            uprv_memcpy(buffer, escSeqCharsCN[cs], 4);
                        } else {
                            U_ASSERT(cs >= CNS_11643_1);
                            uprv_memcpy(buffer, escSeqCharsCN[CNS_11643 + (cs - CNS_11643_1)], 4);
                        }
                        len = 4;
                        pFromU2022State->cs[g] = cs;
                        if(g == 1) {
                            /* changing the SO/G1 charset invalidates the choices[] */
                            choiceCount = 0;
                        }
                    }

                    /* write the shift sequence if necessary */
                    if(g != pFromU2022State->g) {
                        switch(g) {
                        case 1:
                            buffer[len++] = UCNV_SO;

                            /* set the new state only if it is the locking shift SO/G1, not for SS2 or SS3 */
                            pFromU2022State->g = 1;
                            break;
                        case 2:
                            buffer[len++] = 0x1b;
                            buffer[len++] = 0x4e;
                            break;
                        default: /* case 3 */
                            buffer[len++] = 0x1b;
                            buffer[len++] = 0x4f;
                            break;
                        }
                    }

                    /* write the two output bytes */
                    buffer[len++] = (char)(targetValue >> 8);
                    buffer[len++] = (char)targetValue;
                } else {
                    /* if we cannot find the character after checking all codepages
                     * then this is an error
                     */
                    *err = U_INVALID_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }
            }

            /* output len>0 bytes in buffer[] */
            if(len == 1) {
                *target++ = buffer[0];
                if(offsets) {
                    *offsets++ = (int32_t)(source - args->source - 1); /* -1: known to be ASCII */
                }
            } else if(len == 2 && (target + 2) <= targetLimit) {
                *target++ = buffer[0];
                *target++ = buffer[1];
                if(offsets) {
                    int32_t sourceIndex = (int32_t)(source - args->source - U16_LENGTH(sourceChar));
                    *offsets++ = sourceIndex;
                    *offsets++ = sourceIndex;
                }
            } else {
                fromUWriteUInt8(
                    cnv,
                    buffer, len,
                    &target, (const char *)targetLimit,
                    &offsets, (int32_t)(source - args->source - U16_LENGTH(sourceChar)),
                    err);
                if(U_FAILURE(*err)) {
                    break;
                }
            }
        } /* end if(myTargetIndex<myTargetLength) */
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }

    }/* end while(mySourceIndex<mySourceLength) */

    /*
     * the end of the input stream and detection of truncated input
     * are handled by the framework, but for ISO-2022-CN conversion
     * we need to be in ASCII mode at the very end
     *
     * conditions:
     *   successful
     *   not in ASCII mode
     *   end of input and no truncated input
     */
    if( U_SUCCESS(*err) &&
        pFromU2022State->g!=0 &&
        args->flush && source>=sourceLimit && cnv->fromUChar32==0
    ) {
        int32_t sourceIndex;

        /* we are switching to ASCII */
        pFromU2022State->g=0;

        /* get the source index of the last input character */
        /*
         * TODO this would be simpler and more reliable if we used a pair
         * of sourceIndex/prevSourceIndex like in ucnvmbcs.c
         * so that we could simply use the prevSourceIndex here;
         * this code gives an incorrect result for the rare case of an unmatched
         * trail surrogate that is alone in the last buffer of the text stream
         */
        sourceIndex=(int32_t)(source-args->source);
        if(sourceIndex>0) {
            --sourceIndex;
            if( U16_IS_TRAIL(args->source[sourceIndex]) &&
                (sourceIndex==0 || U16_IS_LEAD(args->source[sourceIndex-1]))
            ) {
                --sourceIndex;
            }
        } else {
            sourceIndex=-1;
        }

        fromUWriteUInt8(
            cnv,
            SHIFT_IN_STR, 1,
            &target, (const char *)targetLimit,
            &offsets, sourceIndex,
            err);
    }

    /*save the state and return */
    args->source = source;
    args->target = (char*)target;
}